

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decode.cc
# Opt level: O0

StatusOr<std::unique_ptr<draco::PointCloudDecoder,_std::default_delete<draco::PointCloudDecoder>_>_>
* draco::CreatePointCloudDecoder(int8_t method)

{
  undefined8 *puVar1;
  char in_SIL;
  StatusOr<std::unique_ptr<draco::PointCloudDecoder,_std::default_delete<draco::PointCloudDecoder>_>_>
  *in_RDI;
  pointer in_stack_ffffffffffffff38;
  Status *status;
  StatusOr<std::unique_ptr<draco::PointCloudDecoder,_std::default_delete<draco::PointCloudDecoder>_>_>
  *in_stack_ffffffffffffff40;
  StatusOr<std::unique_ptr<draco::PointCloudDecoder,_std::default_delete<draco::PointCloudDecoder>_>_>
  *pSVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff80;
  string local_78 [72];
  StatusOr<std::unique_ptr<draco::PointCloudDecoder,_std::default_delete<draco::PointCloudDecoder>_>_>
  local_30;
  
  if (in_SIL == '\0') {
    puVar1 = (undefined8 *)operator_new(0x58);
    puVar1[8] = 0;
    puVar1[9] = 0;
    puVar1[6] = 0;
    puVar1[7] = 0;
    puVar1[4] = 0;
    puVar1[5] = 0;
    puVar1[2] = 0;
    puVar1[3] = 0;
    *puVar1 = 0;
    puVar1[1] = 0;
    puVar1[10] = 0;
    PointCloudSequentialDecoder::PointCloudSequentialDecoder
              ((PointCloudSequentialDecoder *)in_stack_ffffffffffffff40);
    std::unique_ptr<draco::PointCloudDecoder,std::default_delete<draco::PointCloudDecoder>>::
    unique_ptr<std::default_delete<draco::PointCloudDecoder>,void>
              ((unique_ptr<draco::PointCloudDecoder,_std::default_delete<draco::PointCloudDecoder>_>
                *)in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
    StatusOr<std::unique_ptr<draco::PointCloudDecoder,_std::default_delete<draco::PointCloudDecoder>_>_>
    ::StatusOr(in_stack_ffffffffffffff40,
               (unique_ptr<draco::PointCloudDecoder,_std::default_delete<draco::PointCloudDecoder>_>
                *)in_stack_ffffffffffffff38);
    std::unique_ptr<draco::PointCloudDecoder,_std::default_delete<draco::PointCloudDecoder>_>::
    ~unique_ptr((unique_ptr<draco::PointCloudDecoder,_std::default_delete<draco::PointCloudDecoder>_>
                 *)in_stack_ffffffffffffff40);
    pSVar2 = in_RDI;
  }
  else if (in_SIL == '\x01') {
    puVar1 = (undefined8 *)operator_new(0x58);
    puVar1[8] = 0;
    puVar1[9] = 0;
    puVar1[6] = 0;
    puVar1[7] = 0;
    puVar1[4] = 0;
    puVar1[5] = 0;
    puVar1[2] = 0;
    puVar1[3] = 0;
    *puVar1 = 0;
    puVar1[1] = 0;
    puVar1[10] = 0;
    PointCloudKdTreeDecoder::PointCloudKdTreeDecoder
              ((PointCloudKdTreeDecoder *)in_stack_ffffffffffffff40);
    pSVar2 = &local_30;
    std::unique_ptr<draco::PointCloudDecoder,std::default_delete<draco::PointCloudDecoder>>::
    unique_ptr<std::default_delete<draco::PointCloudDecoder>,void>
              ((unique_ptr<draco::PointCloudDecoder,_std::default_delete<draco::PointCloudDecoder>_>
                *)pSVar2,in_stack_ffffffffffffff38);
    StatusOr<std::unique_ptr<draco::PointCloudDecoder,_std::default_delete<draco::PointCloudDecoder>_>_>
    ::StatusOr(pSVar2,(unique_ptr<draco::PointCloudDecoder,_std::default_delete<draco::PointCloudDecoder>_>
                       *)in_stack_ffffffffffffff38);
    std::unique_ptr<draco::PointCloudDecoder,_std::default_delete<draco::PointCloudDecoder>_>::
    ~unique_ptr((unique_ptr<draco::PointCloudDecoder,_std::default_delete<draco::PointCloudDecoder>_>
                 *)pSVar2);
    pSVar2 = in_RDI;
  }
  else {
    status = (Status *)&stack0xffffffffffffff87;
    pSVar2 = in_RDI;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffff80,(char *)pSVar2,(allocator<char> *)in_RDI);
    Status::Status(&in_stack_ffffffffffffff40->status_,(Code)((ulong)status >> 0x20),
                   (string *)0x14ca61);
    StatusOr<std::unique_ptr<draco::PointCloudDecoder,_std::default_delete<draco::PointCloudDecoder>_>_>
    ::StatusOr(in_stack_ffffffffffffff40,status);
    Status::~Status((Status *)0x14ca7e);
    std::__cxx11::string::~string(local_78);
    std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff87);
  }
  return pSVar2;
}

Assistant:

StatusOr<std::unique_ptr<PointCloudDecoder>> CreatePointCloudDecoder(
    int8_t method) {
  if (method == POINT_CLOUD_SEQUENTIAL_ENCODING) {
    return std::unique_ptr<PointCloudDecoder>(
        new PointCloudSequentialDecoder());
  } else if (method == POINT_CLOUD_KD_TREE_ENCODING) {
    return std::unique_ptr<PointCloudDecoder>(new PointCloudKdTreeDecoder());
  }
  return Status(Status::DRACO_ERROR, "Unsupported encoding method.");
}